

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RootObjectBase.cpp
# Opt level: O2

uint __thiscall
Js::RootObjectBase::ReleaseInlineCache
          (RootObjectBase *this,PropertyId propertyId,bool isLoadMethod,bool isStore,bool isShutdown
          )

{
  BaseDictionary<const_Js::PropertyRecord_*,_Js::RootObjectInlineCache_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_00;
  RootObjectInlineCache *this_01;
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  undefined4 *puVar4;
  undefined7 in_register_00000009;
  long lVar5;
  undefined7 in_register_00000011;
  uint uVar6;
  PropertyId local_40;
  int local_3c;
  PropertyId propertyId_local;
  int last;
  uint targetBucket;
  int i;
  
  lVar5 = 0x38;
  if ((int)CONCAT71(in_register_00000009,isStore) == 0) {
    lVar5 = (CONCAT71(in_register_00000011,isLoadMethod) & 0xffffffff) * 8 + 0x28;
  }
  this_00 = *(BaseDictionary<const_Js::PropertyRecord_*,_Js::RootObjectInlineCache_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
              **)((long)&(this->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
                         super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject + lVar5);
  local_40 = propertyId;
  bVar2 = JsUtil::
          BaseDictionary<const_Js::PropertyRecord_*,_Js::RootObjectInlineCache_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
          ::FindEntryWithKey<int>(this_00,&local_40,&last,&local_3c,(uint *)&propertyId_local);
  if (bVar2) {
    this_01 = (this_00->entries).ptr[last].
              super_DefaultHashedEntry<Memory::WriteBarrierPtr<const_Js::PropertyRecord>,_Memory::WriteBarrierPtr<Js::RootObjectInlineCache>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
              .
              super_KeyValueEntry<Memory::WriteBarrierPtr<const_Js::PropertyRecord>,_Memory::WriteBarrierPtr<Js::RootObjectInlineCache>_>
              .
              super_ValueEntry<Memory::WriteBarrierPtr<Js::RootObjectInlineCache>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Memory::WriteBarrierPtr<const_Js::PropertyRecord>,_Memory::WriteBarrierPtr<Js::RootObjectInlineCache>_>_>
              .
              super_KeyValueEntryDataLayout2<Memory::WriteBarrierPtr<const_Js::PropertyRecord>,_Memory::WriteBarrierPtr<Js::RootObjectInlineCache>_>
              .value.ptr;
    uVar3 = RootObjectInlineCache::Release(this_01);
    uVar6 = 0;
    if (uVar3 == 0) {
      uVar6 = 0;
      if (!isShutdown) {
        bVar2 = InlineCache::RemoveFromInvalidationList((this_01->inlineCache).ptr);
        uVar6 = (uint)bVar2;
        Memory::
        DeleteObject<Memory::InlineCacheAllocator,(Memory::AllocatorDeleteFlags)0,Js::InlineCache>
                  (&((((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->
                       javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr)->
                    inlineCacheAllocator,(this_01->inlineCache).ptr);
      }
      JsUtil::
      BaseDictionary<const_Js::PropertyRecord_*,_Js::RootObjectInlineCache_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
      ::RemoveAt(this_00,last,local_3c,propertyId_local);
    }
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/RootObjectBase.cpp"
                                ,0x72,"(found)","found");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
    uVar6 = 0;
  }
  return uVar6;
}

Assistant:

uint
    RootObjectBase::ReleaseInlineCache(Js::PropertyId propertyId, bool isLoadMethod, bool isStore, bool isShutdown)
    {
        uint unregisteredInlineCacheCount = 0;

        RootObjectInlineCacheMap * inlineCacheMap = isStore ? storeInlineCacheMap :
            isLoadMethod ? loadMethodInlineCacheMap : loadInlineCacheMap;
        bool found = false;
        inlineCacheMap->RemoveIfWithKey(propertyId,
            [this, isShutdown, &unregisteredInlineCacheCount, &found](PropertyRecord const * propertyRecord, RootObjectInlineCache * rootObjectInlineCache)
            {
                found = true;
                if (rootObjectInlineCache->Release() == 0)
                {
                    // If we're not shutting down, we need to remove this cache from thread context's invalidation list (if any),
                    // and release memory back to the arena.  During script context shutdown, we leave everything in place, because
                    // the inline cache arena will stay alive until script context is destroyed (as in destructor called as opposed to
                    // Close called) and thus the invalidation lists are safe to keep references to caches from this script context.
                    if (!isShutdown)
                    {
                        if (rootObjectInlineCache->GetInlineCache()->RemoveFromInvalidationList())
                        {
                            unregisteredInlineCacheCount++;

                        }
                        AllocatorDelete(InlineCacheAllocator, this->GetScriptContext()->GetInlineCacheAllocator(), rootObjectInlineCache->GetInlineCache());
                    }
                    return true; // Remove from the map
                }
                return false; // don't remove from the map
            }
        );
        Assert(found);
        return unregisteredInlineCacheCount;
    }